

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O2

void __thiscall cppnet::ConnectSocket::Accept(ConnectSocket *this)

{
  Event *pEVar1;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  __shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<cppnet::EventActions> actions;
  __shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->_accept_event == (Event *)0x0) {
    pEVar1 = (Event *)operator_new(0x28);
    pEVar1->_vptr_Event = (_func_int **)&PTR__Event_00125160;
    pEVar1->_data = (void *)0x0;
    pEVar1->_event_type = 0;
    (pEVar1->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pEVar1->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->_accept_event = pEVar1;
    std::__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::ConnectSocket,void>
              ((__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2> *)&actions,
               (__weak_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::ConnectSocket>);
    local_38._M_ptr =
         (element_type *)
         actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._M_refcount._M_pi =
         actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)&pEVar1->_socket,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::ConnectSocket,void>
            ((__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2> *)&actions,
             (__weak_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppnet::ConnectSocket>);
  this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)Socket::__all_socket_map();
  this_01 = (__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[](this_00,&(this->super_Socket)._sock);
  std::__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2> *)&actions);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_Socket)._event_actions);
  if (actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*(actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_EventActions[6])
              (actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               this->_accept_event);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ConnectSocket::Accept() {
    if (!_accept_event) {
        _accept_event = new Event();
        _accept_event->SetSocket(shared_from_this());
    }
    __all_socket_map[_sock] = shared_from_this();
    auto actions = GetEventActions();
    if (actions) {
        actions->AddAcceptEvent(_accept_event);
    }
}